

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ql_node.cc
# Opt level: O0

RC __thiscall QL_Node::PrintCondition(QL_Node *this,Condition condition)

{
  ostream *poVar1;
  size_t sVar2;
  RC rc;
  QL_Node *this_local;
  
  if (condition.lhsAttr.relName == (char *)0x0) {
    std::operator<<((ostream *)&std::cout,"NULL");
  }
  else {
    std::operator<<((ostream *)&std::cout,condition.lhsAttr.relName);
  }
  poVar1 = std::operator<<((ostream *)&std::cout,".");
  std::operator<<(poVar1,condition.lhsAttr.attrName);
  switch(condition.op) {
  case EQ_OP:
    std::operator<<((ostream *)&std::cout,"=");
    break;
  case NE_OP:
    std::operator<<((ostream *)&std::cout,"!=");
    break;
  case LT_OP:
    std::operator<<((ostream *)&std::cout,"<");
    break;
  case GT_OP:
    std::operator<<((ostream *)&std::cout,">");
    break;
  case LE_OP:
    std::operator<<((ostream *)&std::cout,"<=");
    break;
  case GE_OP:
    std::operator<<((ostream *)&std::cout,">=");
    break;
  default:
    return 0x195;
  }
  if (condition.bRhsIsAttr == 0) {
    if (condition.rhsValue.type == INT) {
      print_int(condition.rhsValue.data,4);
    }
    else if (condition.rhsValue.type == FLOAT) {
      print_float(condition.rhsValue.data,4);
    }
    else {
      sVar2 = strlen((char *)condition.rhsValue.data);
      print_string(condition.rhsValue.data,(int)sVar2);
    }
  }
  else {
    if (condition.rhsAttr.relName == (char *)0x0) {
      std::operator<<((ostream *)&std::cout,"NULL");
    }
    else {
      std::operator<<((ostream *)&std::cout,condition.rhsAttr.relName);
    }
    poVar1 = std::operator<<((ostream *)&std::cout,".");
    std::operator<<(poVar1,condition.rhsAttr.attrName);
  }
  return 0;
}

Assistant:

RC QL_Node::PrintCondition(const Condition condition){
  RC rc = 0;

  // Print the LHS attribute
  if(condition.lhsAttr.relName == NULL){
    cout << "NULL";
  }
  else
    cout << condition.lhsAttr.relName;
  cout << "." << condition.lhsAttr.attrName;

  // Print the operator
  switch(condition.op){
    case EQ_OP : cout << "="; break;
    case LT_OP : cout << "<"; break;
    case GT_OP : cout << ">"; break;
    case LE_OP : cout << "<="; break;
    case GE_OP : cout << ">="; break;
    case NE_OP : cout << "!="; break;
    default: return (QL_BADCOND);
  }
  // If the RHS is an attribute, print it
  if(condition.bRhsIsAttr){
    if(condition.rhsAttr.relName == NULL){
      cout << "NULL";
    }
    else
      cout << condition.rhsAttr.relName;
    cout << "." << condition.rhsAttr.attrName;
  }
  else{ // selects the correct printer format for this attribute
    if(condition.rhsValue.type == INT){
      print_int(condition.rhsValue.data, 4);
    }
    else if(condition.rhsValue.type == FLOAT){
      print_float(condition.rhsValue.data, 4);
    }
    else{
      print_string(condition.rhsValue.data, strlen((const char *)condition.rhsValue.data));
    }
  }

  return (0);
}